

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

int __thiscall deci::ast_if_t::Generate(ast_if_t *this,ostream *output,int pc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 in_register_00000014;
  
  iVar1 = (*this->condition->_vptr_ast_item_t[2])
                    (this->condition,output,CONCAT44(in_register_00000014,pc));
  poVar4 = std::operator<<(output,"jz __label_");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,"__");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar2 = ast_t::Generate(this->true_path,output,iVar1 + 1);
  iVar3 = iVar2;
  if (this->else_path != (ast_t *)0x0) {
    poVar4 = std::operator<<(output,"jmp __label_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,"__");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(output,": __label_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,"__");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = ast_t::Generate(this->else_path,output,iVar2 + 1);
    iVar1 = iVar2;
  }
  poVar4 = std::operator<<(output,": __label_");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,"__");
  std::endl<char,std::char_traits<char>>(poVar4);
  return iVar3;
}

Assistant:

int ast_if_t::Generate(std::ostream& output, int pc) const {
    pc = this->condition->Generate(output, pc);

    int true_loc = pc;

    output << "jz __label_" << true_loc << "__" << std::endl;
    pc = this->true_path->Generate(output, pc + 1);

    if (this->else_path != nullptr)
    {
      int else_loc = pc;
      output << "jmp __label_" << else_loc << "__" << std::endl;
      output << ": __label_" << true_loc << "__" << std::endl;
      pc = this->else_path->Generate(output, pc + 1);
      output << ": __label_" << else_loc << "__" << std::endl;
    }
    else
    {
      output << ": __label_" << true_loc << "__" << std::endl;
    }
    return pc;
  }